

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityReferenceImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMEntityReferenceImpl::DOMEntityReferenceImpl
          (DOMEntityReferenceImpl *this,DOMEntityReferenceImpl *other,bool deep)

{
  bool deep_local;
  DOMEntityReferenceImpl *other_local;
  DOMEntityReferenceImpl *this_local;
  
  DOMEntityReference::DOMEntityReference
            (&this->super_DOMEntityReference,&other->super_DOMEntityReference);
  HasDOMNodeImpl::HasDOMNodeImpl(&this->super_HasDOMNodeImpl);
  HasDOMParentImpl::HasDOMParentImpl(&this->super_HasDOMParentImpl);
  HasDOMChildImpl::HasDOMChildImpl(&this->super_HasDOMChildImpl);
  (this->super_DOMEntityReference).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMEntityReferenceImpl_0052aad0;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_0052ac58;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_0052ac88;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_0052acb8;
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,&other->fNode);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,&other->fParent);
  DOMChildNode::DOMChildNode(&this->fChild,&other->fChild);
  this->fName = other->fName;
  this->fBaseURI = other->fBaseURI;
  if (deep) {
    DOMParentNode::cloneChildren(&this->fParent,(DOMNode *)other);
  }
  DOMNodeImpl::setReadOnly(&this->fNode,true,true);
  return;
}

Assistant:

DOMEntityReferenceImpl::DOMEntityReferenceImpl(const DOMEntityReferenceImpl &other, bool deep)
    : DOMEntityReference(other),
      fNode(this, other.fNode),
      fParent(this, other.fParent),
      fChild(other.fChild),
      fName(other.fName),
      fBaseURI(other.fBaseURI)
{
    if (deep)
        fParent.cloneChildren(&other);
    fNode.setReadOnly(true, true);
}